

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qvnc.cpp
# Opt level: O1

int __thiscall QVncServer::init(QVncServer *this,EVP_PKEY_CTX *ctx)

{
  QDebug this_00;
  char cVar1;
  QTcpServer *this_01;
  long in_FS_OFFSET;
  QByteArrayView QVar2;
  QObject local_70 [8];
  undefined4 local_68;
  undefined8 local_64;
  undefined8 uStack_5c;
  undefined4 local_54;
  char *local_50;
  QDebug local_48;
  QString local_40;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  this_01 = (QTcpServer *)operator_new(0x10);
  QTcpServer::QTcpServer(this_01,&this->super_QObject);
  this->serverSocket = this_01;
  QHostAddress::QHostAddress((QHostAddress *)&local_68,Any);
  cVar1 = QTcpServer::listen((QHostAddress *)this_01,(ushort)(QHostAddress *)&local_68);
  QHostAddress::~QHostAddress((QHostAddress *)&local_68);
  if (cVar1 == '\0') {
    local_68 = 2;
    local_64 = 0;
    uStack_5c = 0;
    local_54 = 0;
    local_50 = "default";
    QMessageLogger::warning();
    this_00.stream = local_48.stream;
    QVar2.m_data = (storage_type *)0x1d;
    QVar2.m_size = (qsizetype)&local_40;
    QString::fromUtf8(QVar2);
    QTextStream::operator<<((QTextStream *)this_00.stream,&local_40);
    if (&(local_40.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_40.d.d)->super_QArrayData,2,0x10);
      }
    }
    if (*(QTextStream *)(local_48.stream + 0x30) == (QTextStream)0x1) {
      QTextStream::operator<<((QTextStream *)local_48.stream,' ');
    }
    QTcpServer::errorString();
    if (local_40.d.ptr == (char16_t *)0x0) {
      local_40.d.ptr = (char16_t *)&QString::_empty;
    }
    QDebug::putString((QChar *)&local_48,(ulong)local_40.d.ptr);
    if (*(QTextStream *)(local_48.stream + 0x30) == (QTextStream)0x1) {
      QTextStream::operator<<((QTextStream *)local_48.stream,' ');
    }
    if (&(local_40.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_40.d.d)->super_QArrayData,2,0x10);
      }
    }
    QDebug::~QDebug(&local_48);
  }
  else {
    init((EVP_PKEY_CTX *)&this->m_port);
  }
  QObject::connect(local_70,(char *)this->serverSocket,(QObject *)"2newConnection()",(char *)this,
                   0x11612d);
  QMetaObject::Connection::~Connection((Connection *)local_70);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return (int)*(long *)(in_FS_OFFSET + 0x28);
  }
  __stack_chk_fail();
}

Assistant:

void QVncServer::init()
{
    serverSocket = new QTcpServer(this);
    if (!serverSocket->listen(QHostAddress::Any, m_port))
        qWarning() << "QVncServer could not connect:" << serverSocket->errorString();
    else
        qWarning("QVncServer created on port %d", m_port);

    connect(serverSocket, SIGNAL(newConnection()), this, SLOT(newConnection()));

}